

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::setProducer(MlmWrap *this,char *stream)

{
  ostream *this_00;
  string *in_RSI;
  MlmWrap *in_RDI;
  int rc;
  allocator *__rhs;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [36];
  int local_14;
  MlmWrap *this_01;
  
  this_01 = in_RDI;
  local_14 = mlm_client_set_producer(in_RDI->client,in_RSI);
  if (local_14 != 0) {
    __rhs = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Could not set producer for ",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    error(this_01,in_RSI);
    this_00 = std::operator<<((ostream *)&std::cerr,local_38);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return local_14;
}

Assistant:

int MlmWrap::setProducer(const char *stream){
    int rc = mlm_client_set_producer(client, stream);
    if(rc){
        std::cerr << error(std::string("Could not set producer for ") + stream) << std::endl;
    }
    return rc;
}